

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMDLoader.cpp
# Opt level: O0

void __thiscall
Assimp::SMDImporter::ParseTriangle(SMDImporter *this,char *szCurrent,char **szCurrentOut)

{
  char *pcVar1;
  char **ppcVar2;
  bool bVar3;
  uint uVar4;
  ulong uVar5;
  uint local_130;
  allocator local_129;
  uint iVert;
  char **local_108;
  char *szLast;
  Face *face;
  Face local_e8;
  char **local_20;
  char **szCurrentOut_local;
  char *szCurrent_local;
  SMDImporter *this_local;
  
  local_20 = szCurrentOut;
  szCurrentOut_local = (char **)szCurrent;
  szCurrent_local = (char *)this;
  SMD::Face::Face(&local_e8);
  std::vector<Assimp::SMD::Face,_std::allocator<Assimp::SMD::Face>_>::push_back
            (&this->asTriangles,&local_e8);
  SMD::Face::~Face(&local_e8);
  szLast = (char *)std::vector<Assimp::SMD::Face,_std::allocator<Assimp::SMD::Face>_>::back
                             (&this->asTriangles);
  bVar3 = SkipSpaces<char>((char *)szCurrentOut_local,(char **)&szCurrentOut_local);
  if (bVar3) {
    local_108 = szCurrentOut_local;
    do {
      pcVar1 = (char *)((long)szCurrentOut_local + 1);
      szCurrentOut_local = (char **)((long)szCurrentOut_local + 1);
      bVar3 = IsSpaceOrNewLine<char>(*pcVar1);
      ppcVar2 = local_108;
    } while (((bVar3 ^ 0xffU) & 1) != 0);
    uVar5 = (long)szCurrentOut_local - (long)local_108;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&iVert,(char *)ppcVar2,uVar5,&local_129);
    uVar4 = GetTextureIndex(this,(string *)&iVert);
    *(uint *)szLast = uVar4;
    std::__cxx11::string::~string((string *)&iVert);
    std::allocator<char>::~allocator((allocator<char> *)&local_129);
    SkipSpacesAndLineEnd(this,(char *)szCurrentOut_local,(char **)&szCurrentOut_local);
    for (local_130 = 0; local_130 < 3; local_130 = local_130 + 1) {
      ParseVertex(this,(char *)szCurrentOut_local,(char **)&szCurrentOut_local,
                  (Vertex *)(szLast + (ulong)local_130 * 0x40 + 8),false);
    }
    *local_20 = (char *)szCurrentOut_local;
  }
  else {
    LogErrorNoThrow(this,"Unexpected EOF/EOL while parsing a triangle");
  }
  return;
}

Assistant:

void SMDImporter::ParseTriangle(const char* szCurrent, const char** szCurrentOut) {
    asTriangles.push_back(SMD::Face());
    SMD::Face& face = asTriangles.back();

    if(!SkipSpaces(szCurrent,&szCurrent)) {
        LogErrorNoThrow("Unexpected EOF/EOL while parsing a triangle");
        return;
    }

    // read the texture file name
    const char* szLast = szCurrent;
    while (!IsSpaceOrNewLine(*++szCurrent));

    // ... and get the index that belongs to this file name
    face.iTexture = GetTextureIndex(std::string(szLast,(uintptr_t)szCurrent-(uintptr_t)szLast));

    SkipSpacesAndLineEnd(szCurrent,&szCurrent);

    // load three vertices
    for (unsigned int iVert = 0; iVert < 3;++iVert) {
        ParseVertex(szCurrent,&szCurrent, face.avVertices[iVert]);
    }
    *szCurrentOut = szCurrent;
}